

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  int *piVar6;
  Layer *pLVar7;
  long lVar8;
  pointer piVar9;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *pvVar10;
  bool bVar11;
  ulong uVar12;
  size_t k;
  long lVar13;
  size_t j;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  pvVar2 = (this->super_ModelWriter).layers;
  ppLVar3 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar4 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = 0;
  do {
    if (uVar12 == (long)ppLVar3 - (long)ppLVar4 >> 3) {
      return 0;
    }
    bVar11 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar12]->type,"Noop");
    if (!bVar11) {
      pLVar5 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar6 == *(pointer *)
                     ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     + 8)) {
        fprintf(_stderr,"eliminate_noop %s\n",(pLVar5->name)._M_dataplus._M_p);
        lVar8 = *(long *)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        piVar9 = *(pointer *)
                  ((long)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
        pvVar10 = (this->super_ModelWriter).blobs;
        for (lVar13 = 0; (long)piVar9 - lVar8 >> 2 != lVar13; lVar13 = lVar13 + 1) {
          (pvVar10->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[*(int *)(lVar8 + lVar13 * 4)].producer = -1;
        }
LAB_00133d6a:
        std::__cxx11::string::assign((char *)&pLVar5->type);
      }
      else {
        iVar1 = *piVar6;
        uVar16 = uVar12 & 0xffffffff;
        while( true ) {
          iVar14 = (int)uVar16;
          uVar15 = iVar14 - 1;
          uVar16 = (ulong)uVar15;
          if ((int)uVar15 < 0) break;
          bVar11 = std::operator==(&(((this->super_ModelWriter).layers)->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                   "ncnnfused");
          if (!bVar11) {
            pLVar7 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar15];
            lVar8 = *(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
            lVar17 = 0;
            for (lVar13 = 0;
                (long)*(pointer *)
                       ((long)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) - lVar8 >> 2 != lVar13; lVar13 = lVar13 + 1) {
              if (*(int *)(lVar8 + lVar13 * 4) == iVar1) {
                if ((int)lVar13 == -1 || iVar14 == 0) goto LAB_00133ca8;
                pLVar7 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
                fprintf(_stderr,"eliminate_noop %s %s\n",(pLVar7->name)._M_dataplus._M_p,
                        (pLVar5->name)._M_dataplus._M_p);
                iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                *(int *)(*(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + (lVar17 >> 0x1e)) = iVar1;
                (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar1].producer = uVar15;
                goto LAB_00133d6a;
              }
              lVar17 = lVar17 + 0x100000000;
            }
          }
        }
      }
    }
LAB_00133ca8:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (size_t j = 0; j < top_blob_count; j++)
            {
                int top_blob_index_final = noop->tops[j];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = noop->bottoms[0];

        int j = i - 1;
        int any_k = -1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool link_noop = false;
            size_t top_blob_count = layers[j]->tops.size();
            for (size_t k = 0; k < top_blob_count; k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    link_noop = true;
                    any_k = k;
                    break;
                }
            }

            if (link_noop)
                break;
        }

        if (j == -1 || any_k == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        int top_blob_index_final = noop->tops[0];
        any->tops[any_k] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;

        noop->type = "ncnnfused";
    }

    return 0;
}